

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZlibWriter.cpp
# Opt level: O0

void __thiscall ZlibWriter::~ZlibWriter(ZlibWriter *this)

{
  ZlibWriter *this_local;
  
  this->_vptr_ZlibWriter = (_func_int **)&PTR__ZlibWriter_00113d88;
  deflateEnd(&this->z);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&this->zbuf);
  return;
}

Assistant:

ZlibWriter::~ZlibWriter()
{
	deflateEnd(&z);
}